

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

CallInfo * growCI(lua_State *L)

{
  CallInfo *pCVar1;
  lua_State *L_local;
  
  if (L->size_ci < 0x4e21) {
    luaD_reallocCI(L,L->size_ci << 1);
    if (20000 < L->size_ci) {
      luaG_runerror(L,"stack overflow");
    }
  }
  else {
    luaD_throw(L,5);
  }
  pCVar1 = L->ci;
  L->ci = pCVar1 + 1;
  return pCVar1 + 1;
}

Assistant:

static CallInfo*growCI(lua_State*L){
if(L->size_ci>20000)
luaD_throw(L,5);
else{
luaD_reallocCI(L,2*L->size_ci);
if(L->size_ci>20000)
luaG_runerror(L,"stack overflow");
}
return++L->ci;
}